

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode InitiateTransfer(Curl_easy *data)

{
  connectdata *conn;
  curl_trc_feat *pcVar1;
  _Bool _Var2;
  CURLcode CVar3;
  curl_off_t recv_size;
  int send_recv;
  bool bVar4;
  _Bool connected;
  _Bool local_19;
  
  conn = data->conn;
  if ((((data->set).field_0x8cd & 0x10) != 0) &&
     (((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)) &&
      (0 < Curl_trc_feat_ftp.log_level)))) {
    Curl_trc_ftp(data,"InitiateTransfer()");
  }
  if ((((((conn->bits).field_0x2 & 2) == 0) || (((data->set).field_0x8cb & 0x10) == 0)) ||
      ((_Var2 = Curl_conn_is_ssl(conn,1), _Var2 ||
       (CVar3 = Curl_ssl_cfilter_add(data,conn,1), CVar3 == CURLE_OK)))) &&
     ((CVar3 = Curl_conn_connect(data,1,true,&local_19), CVar3 == CURLE_OK &&
      (CVar3 = CURLE_OK, local_19 == true)))) {
    bVar4 = (conn->proto).ftpc.state_saved != '!';
    if (bVar4) {
      recv_size = (conn->proto).ftpc.retr_size_saved;
      send_recv = 1;
    }
    else {
      Curl_pgrsSetUploadSize(data,(data->state).infilesize);
      send_recv = 2;
      recv_size = -1;
    }
    Curl_xfer_setup2(data,send_recv,recv_size,true,!bVar4);
    *(undefined1 *)((long)&conn->proto + 8) = 1;
    CVar3 = CURLE_OK;
    _ftp_state(data,'\0');
  }
  return CVar3;
}

Assistant:

static CURLcode InitiateTransfer(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  bool connected;

  CURL_TRC_FTP(data, "InitiateTransfer()");
  if(conn->bits.ftp_use_data_ssl && data->set.ftp_use_port &&
     !Curl_conn_is_ssl(conn, SECONDARYSOCKET)) {
    result = Curl_ssl_cfilter_add(data, conn, SECONDARYSOCKET);
    if(result)
      return result;
  }
  result = Curl_conn_connect(data, SECONDARYSOCKET, TRUE, &connected);
  if(result || !connected)
    return result;

  if(conn->proto.ftpc.state_saved == FTP_STOR) {
    /* When we know we are uploading a specified file, we can get the file
       size prior to the actual upload. */
    Curl_pgrsSetUploadSize(data, data->state.infilesize);

    /* set the SO_SNDBUF for the secondary socket for those who need it */
    Curl_sndbuf_init(conn->sock[SECONDARYSOCKET]);

    /* FTP upload, shutdown DATA, ignore shutdown errors, as we rely
     * on the server response on the CONTROL connection. */
    Curl_xfer_setup2(data, CURL_XFER_SEND, -1, TRUE, TRUE);
  }
  else {
    /* FTP download, shutdown, do not ignore errors */
    Curl_xfer_setup2(data, CURL_XFER_RECV,
                     conn->proto.ftpc.retr_size_saved, TRUE, FALSE);
  }

  conn->proto.ftpc.pp.pending_resp = TRUE; /* expect server response */
  ftp_state(data, FTP_STOP);

  return CURLE_OK;
}